

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

XMLSize_t __thiscall
xercesc_4_0::XPathScanner::scanNCName
          (XPathScanner *this,XMLCh *data,XMLSize_t endOffset,XMLSize_t currentOffset)

{
  ulong uVar1;
  
  if (((ulong)(ushort)data[currentOffset] != 0x3a) &&
     (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[currentOffset]] & 2) != 0)) {
    uVar1 = currentOffset + 1;
    if (currentOffset + 1 < endOffset) {
      uVar1 = endOffset;
    }
    do {
      currentOffset = currentOffset + 1;
      if (endOffset <= currentOffset) {
        return uVar1;
      }
    } while (((&XMLChar1_0::fgCharCharsTable1_0)[(ushort)data[currentOffset]] & 1) != 0);
  }
  return currentOffset;
}

Assistant:

XMLSize_t XPathScanner::scanNCName(const XMLCh* const data,
                             const XMLSize_t endOffset,
                             XMLSize_t currentOffset) {

    XMLCh ch = data[currentOffset];

    if (!XMLChar1_0::isFirstNCNameChar(ch)) {
        return currentOffset;
    }

    while (++currentOffset < endOffset) {

        ch = data[currentOffset];

        if (!XMLChar1_0::isNCNameChar(ch)) {
            break;
        }
    }

    return currentOffset;
}